

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigUtil.c
# Opt level: O2

void Fraig_PrintNode(Fraig_Man_t *p,Fraig_Node_t *pNode)

{
  Fraig_Node_t *p_00;
  int iVar1;
  Fraig_NodeVec_t *p_01;
  long lVar2;
  
  p_01 = Fraig_DfsOne(p,pNode,0);
  for (lVar2 = 0; lVar2 < p_01->nSize; lVar2 = lVar2 + 1) {
    p_00 = p_01->pArray[lVar2];
    iVar1 = Fraig_NodeIsVar(p_00);
    if (iVar1 == 0) {
      printf("%3d : %c%3d %c%3d   ",(ulong)(uint)p_00->Num,(ulong)(((uint)p_00->p1 & 1) * 2 + 0x2b),
             (ulong)*(uint *)((ulong)p_00->p1 & 0xfffffffffffffffe),
             (ulong)(((uint)p_00->p2 & 1) * 2 + 0x2b),
             (ulong)*(uint *)((ulong)p_00->p2 & 0xfffffffffffffffe));
    }
    else {
      printf("%3d : PI          ",(ulong)(uint)p_00->Num);
    }
    Fraig_PrintBinary(_stdout,(uint *)&p_00->puSimR,0x14);
    printf("   ");
    Fraig_PrintBinary(_stdout,(uint *)&p_00->puSimD,0x14);
    printf("  %d\n",(ulong)(*(uint *)&p_00->field_0x18 & 1));
  }
  Fraig_NodeVecFree(p_01);
  return;
}

Assistant:

void Fraig_PrintNode( Fraig_Man_t * p, Fraig_Node_t * pNode )
{
    Fraig_NodeVec_t * vNodes;
    Fraig_Node_t * pTemp;
    int fCompl1, fCompl2, i;

    vNodes = Fraig_DfsOne( p, pNode, 0 );
    for ( i = 0; i < vNodes->nSize; i++ )
    {
        pTemp = vNodes->pArray[i];
        if ( Fraig_NodeIsVar(pTemp) )
        {
            printf( "%3d : PI          ", pTemp->Num );
            Fraig_PrintBinary( stdout, (unsigned *)&pTemp->puSimR, 20 );
            printf( "   " );
            Fraig_PrintBinary( stdout, (unsigned *)&pTemp->puSimD, 20 );
            printf( "  %d\n", pTemp->fInv );
            continue;
        }

        fCompl1 = Fraig_IsComplement(pTemp->p1);
        fCompl2 = Fraig_IsComplement(pTemp->p2);
        printf( "%3d : %c%3d %c%3d   ", pTemp->Num,
            (fCompl1? '-':'+'), Fraig_Regular(pTemp->p1)->Num,
            (fCompl2? '-':'+'), Fraig_Regular(pTemp->p2)->Num );
        Fraig_PrintBinary( stdout, (unsigned *)&pTemp->puSimR, 20 );
        printf( "   " );
        Fraig_PrintBinary( stdout, (unsigned *)&pTemp->puSimD, 20 );
        printf( "  %d\n", pTemp->fInv );
    }
    Fraig_NodeVecFree( vNodes );
}